

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall slang::ast::Scope::handleNameConflict(Scope *this,Symbol *member)

{
  char *pcVar1;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  Symbol *existing;
  uint uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  uint64_t uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  undefined1 auVar13 [16];
  
  this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this->nameMap;
  uVar9 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    (this_00,&member->name);
  uVar11 = uVar9 >> ((byte)*this_00 & 0x3f);
  lVar10 = (uVar9 & 0xff) * 4;
  cVar3 = (&UNK_0049e39c)[lVar10];
  cVar4 = (&UNK_0049e39d)[lVar10];
  cVar5 = (&UNK_0049e39e)[lVar10];
  cVar6 = (&UNK_0049e39f)[lVar10];
  lVar10 = 0;
  do {
    pcVar1 = (char *)(*(long *)(this_00 + 0x10) + uVar11 * 0x10);
    auVar13[0] = -(*pcVar1 == cVar3);
    auVar13[1] = -(pcVar1[1] == cVar4);
    auVar13[2] = -(pcVar1[2] == cVar5);
    auVar13[3] = -(pcVar1[3] == cVar6);
    auVar13[4] = -(pcVar1[4] == cVar3);
    auVar13[5] = -(pcVar1[5] == cVar4);
    auVar13[6] = -(pcVar1[6] == cVar5);
    auVar13[7] = -(pcVar1[7] == cVar6);
    auVar13[8] = -(pcVar1[8] == cVar3);
    auVar13[9] = -(pcVar1[9] == cVar4);
    auVar13[10] = -(pcVar1[10] == cVar5);
    auVar13[0xb] = -(pcVar1[0xb] == cVar6);
    auVar13[0xc] = -(pcVar1[0xc] == cVar3);
    auVar13[0xd] = -(pcVar1[0xd] == cVar4);
    auVar13[0xe] = -(pcVar1[0xe] == cVar5);
    auVar13[0xf] = -(pcVar1[0xf] == cVar6);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
    if (uVar8 != 0) {
      lVar12 = *(long *)(this_00 + 0x18);
      do {
        uVar2 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)
              ((ulong)uVar2 * 0x18 + lVar12 + uVar11 * 0x168);
        bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           this_00,&member->name,__y);
        if (bVar7) {
          existing = (Symbol *)__y[1]._M_len;
          if (member->kind == ExplicitImport) {
            checkImportConflict(this,member,existing);
            return;
          }
          reportNameConflict(this,member,existing);
          return;
        }
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
    }
    lVar12 = uVar11 + lVar10;
    lVar10 = lVar10 + 1;
    uVar11 = lVar12 + 1U & *(ulong *)(this_00 + 8);
  } while( true );
}

Assistant:

void Scope::handleNameConflict(const Symbol& member) const {
    auto existing = nameMap->find(member.name)->second;
    SLANG_ASSERT(existing);
    if (member.kind == SymbolKind::ExplicitImport)
        checkImportConflict(member, *existing);
    else
        reportNameConflict(member, *existing);
}